

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QRect __thiscall QComboBoxPrivate::popupGeometry(QComboBoxPrivate *this,QPoint *globalPosition)

{
  bool bVar1;
  QPoint *globalPosition_00;
  QWidget *in_RSI;
  QComboBoxPrivate *in_RDI;
  QRect QVar2;
  QComboBox *q;
  undefined1 local_10 [16];
  undefined1 auVar3 [12];
  
  globalPosition_00 = (QPoint *)q_func(in_RDI);
  bVar1 = QStylePrivate::useFullScreenForPopup();
  if (bVar1) {
    local_10 = (undefined1  [16])QWidgetPrivate::screenGeometry(in_RSI,globalPosition_00,false);
  }
  else {
    local_10 = (undefined1  [16])
               QWidgetPrivate::availableScreenGeometry(in_RSI,globalPosition_00,false);
  }
  QVar2.x1.m_i = local_10._0_4_;
  auVar3._4_4_ = local_10._4_4_;
  QVar2.x2.m_i = local_10._8_4_;
  QVar2.y2.m_i = local_10._12_4_;
  return QVar2;
}

Assistant:

QRect QComboBoxPrivate::popupGeometry(const QPoint &globalPosition) const
{
    Q_Q(const QComboBox);
    return QStylePrivate::useFullScreenForPopup()
        ? QWidgetPrivate::screenGeometry(q, globalPosition)
        : QWidgetPrivate::availableScreenGeometry(q, globalPosition);
}